

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

string * google::protobuf::util::anon_unknown_0::
         GetTypeUrl<proto2_unittest::TestAllTypes_RepeatedGroup>(void)

{
  Descriptor *this;
  char *in_RCX;
  string *in_RDI;
  string_view sVar1;
  undefined8 local_20;
  undefined8 local_18;
  
  this = proto2_unittest::TestAllTypes_RepeatedGroup::descriptor();
  sVar1 = Descriptor::full_name(this);
  local_20 = (_anonymous_namespace_ *)sVar1._M_len;
  local_18 = sVar1._M_str;
  sVar1._M_str = in_RCX;
  sVar1._M_len = (size_t)local_18;
  util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_(in_RDI,local_20,sVar1);
  return in_RDI;
}

Assistant:

std::string GetTypeUrl() {
  return GetTypeUrl(T::descriptor()->full_name());
}